

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmSetPropertyCommand::HandleCacheEntry(cmSetPropertyCommand *this,string *cacheKey)

{
  string *propertyName;
  char *pcVar1;
  cmState *this_00;
  allocator local_49;
  string local_48;
  
  propertyName = &this->PropertyName;
  pcVar1 = (this->PropertyValue)._M_dataplus._M_p;
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  if (this->Remove == true) {
    cmState::RemoveCacheEntryProperty(this_00,cacheKey,propertyName);
  }
  if (this->AppendMode == true) {
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    cmState::AppendCacheEntryProperty(this_00,cacheKey,propertyName,&local_48,this->AppendAsString);
  }
  else {
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    cmState::SetCacheEntryProperty(this_00,cacheKey,propertyName,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheEntry(std::string const& cacheKey)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  cmState* state = this->Makefile->GetState();
  if (this->Remove) {
    state->RemoveCacheEntryProperty(cacheKey, name);
  }
  if (this->AppendMode) {
    state->AppendCacheEntryProperty(cacheKey, name, value,
                                    this->AppendAsString);
  } else {
    state->SetCacheEntryProperty(cacheKey, name, value);
  }

  return true;
}